

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectP33xx(P33X *pP33x)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((P33X *)addrsP33x[lVar2] == pP33x) {
      iVar1 = DisconnectP33x(pP33x);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsP33x[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectP33xx(P33X* pP33x)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectP33x(pP33x);
	if (res != EXIT_SUCCESS) return res;

	addrsP33x[id] = NULL;

	return EXIT_SUCCESS;
}